

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

void __thiscall deqp::gls::FboUtil::addFormats(FboUtil *this,FormatDB *db,FormatEntries stdFmts)

{
  Pair<deqp::gls::FboUtil::FormatFlags,_deqp::gls::Range<unsigned_int>_> *pPVar1;
  uint *puVar2;
  ImageFormat format;
  FormatKey *local_30;
  FormatKey *it2;
  FormatEntry *it;
  FormatDB *db_local;
  FormatEntries stdFmts_local;
  
  stdFmts_local.m_begin = stdFmts.m_begin;
  db_local = db;
  it2 = &Range<deqp::gls::Pair<deqp::gls::FboUtil::FormatFlags,_deqp::gls::Range<unsigned_int>_>_>::
         begin((Range<deqp::gls::Pair<deqp::gls::FboUtil::FormatFlags,_deqp::gls::Range<unsigned_int>_>_>
                *)&db_local)->first;
  while( true ) {
    pPVar1 = Range<deqp::gls::Pair<deqp::gls::FboUtil::FormatFlags,_deqp::gls::Range<unsigned_int>_>_>
             ::end((Range<deqp::gls::Pair<deqp::gls::FboUtil::FormatFlags,_deqp::gls::Range<unsigned_int>_>_>
                    *)&db_local);
    if ((Pair<deqp::gls::FboUtil::FormatFlags,_deqp::gls::Range<unsigned_int>_> *)it2 == pPVar1)
    break;
    local_30 = Range<unsigned_int>::begin((Range<unsigned_int> *)(it2 + 2));
    while( true ) {
      puVar2 = Range<unsigned_int>::end((Range<unsigned_int> *)(it2 + 2));
      if (local_30 == puVar2) break;
      format = formatKeyInfo(*local_30);
      FormatDB::addCoreFormat((FormatDB *)this,format,*it2);
      local_30 = local_30 + 1;
    }
    it2 = it2 + 6;
  }
  return;
}

Assistant:

void addFormats (FormatDB& db, FormatEntries stdFmts)
{
	for (const FormatEntry* it = stdFmts.begin(); it != stdFmts.end(); it++)
	{
		for (const FormatKey* it2 = it->second.begin(); it2 != it->second.end(); it2++)
			db.addCoreFormat(formatKeyInfo(*it2), it->first);
	}
}